

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.hpp
# Opt level: O1

long * __thiscall Omega_h::HostRead<long>::operator[](HostRead<long> *this,LO i)

{
  return (long *)((long)i * 8 + (long)(this->read_).write_.shared_alloc_.direct_ptr);
}

Assistant:

OMEGA_H_DEVICE T& operator[](LO i) const OMEGA_H_NOEXCEPT {
#ifdef OMEGA_H_CHECK_BOUNDS
    OMEGA_H_CHECK_OP(0, <=, i);
    OMEGA_H_CHECK_OP(i, <, size());
#endif
#ifdef OMEGA_H_USE_KOKKOS
    return view_(i);
#else
    return data()[i];
#endif
  }